

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftraster.c
# Opt level: O1

Bool Insert_Y_Turn(black_PWorker worker,Int y)

{
  uint uVar1;
  PLong plVar2;
  PLong plVar3;
  bool bVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  
  uVar1 = worker->numTurns;
  plVar2 = worker->sizeBuff;
  lVar8 = (long)(int)uVar1;
  lVar9 = (long)(int)(uVar1 - 1) + 1;
  uVar5 = (ulong)uVar1;
  do {
    uVar6 = uVar5;
    if ((int)uVar6 < 1) goto LAB_0024110f;
    lVar9 = lVar9 + -1;
    uVar5 = uVar6 - 1;
  } while ((long)y < plVar2[(uVar6 - 1) - lVar8]);
  if (plVar2[(uVar6 - 1) - lVar8] < (long)y) {
    do {
      iVar7 = (int)plVar2[lVar9 - lVar8];
      plVar2[lVar9 - lVar8] = (long)y;
      lVar10 = lVar9 + -1;
      bVar4 = 0 < lVar9;
      lVar9 = lVar10;
      y = iVar7;
    } while (bVar4);
  }
  else {
LAB_0024110f:
    lVar10 = uVar6 - 1;
    iVar7 = y;
  }
  if ((int)lVar10 < 0) {
    plVar3 = worker->maxBuff;
    worker->maxBuff = plVar3 + -1;
    if (plVar3 + -1 <= worker->top) {
      worker->error = 0x62;
      return '\x01';
    }
    worker->numTurns = uVar1 + 1;
    plVar2[(int)~uVar1] = (long)iVar7;
  }
  return '\0';
}

Assistant:

static Bool
  Insert_Y_Turn( RAS_ARGS Int  y )
  {
    PLong  y_turns;
    Int    n;


    n       = ras.numTurns - 1;
    y_turns = ras.sizeBuff - ras.numTurns;

    /* look for first y value that is <= */
    while ( n >= 0 && y < y_turns[n] )
      n--;

    /* if it is <, simply insert it, ignore if == */
    if ( n >= 0 && y > y_turns[n] )
      do
      {
        Int  y2 = (Int)y_turns[n];


        y_turns[n] = y;
        y = y2;
      } while ( --n >= 0 );

    if ( n < 0 )
    {
      ras.maxBuff--;
      if ( ras.maxBuff <= ras.top )
      {
        ras.error = FT_THROW( Raster_Overflow );
        return FAILURE;
      }
      ras.numTurns++;
      ras.sizeBuff[-ras.numTurns] = y;
    }

    return SUCCESS;
  }